

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChLinkRevoluteSpherical::Get_react_force_body1
          (ChVector<double> *__return_storage_ptr__,ChLinkRevoluteSpherical *this)

{
  ChVector<double>::operator-(&(this->super_ChLink).react_force);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkRevoluteSpherical::Get_react_force_body1() {
    // Calculate the reaction forces on Body 1 in the joint frame
    // (Note: origin of the joint frame is at the center of the revolute joint
    //  which is defined on body 1, the x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    //  react_force = (-lam_dist,0,-lam_dot)

    return -react_force;
}